

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdcat.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  int iVar2;
  char local_48 [4];
  int c;
  bsdcat bsdcat_storage;
  bsdcat *bsdcat;
  char **argv_local;
  int argc_local;
  
  bsdcat_storage.argument = local_48;
  memset(bsdcat_storage.argument,0,0x28);
  lafe_setprogname(*argv,"bsdcat");
  *(char ***)(bsdcat_storage.argument + 0x18) = argv;
  *(int *)(bsdcat_storage.argument + 0x10) = argc;
  iVar2 = bsdcat_getopt((bsdcat *)bsdcat_storage.argument);
  if (iVar2 == -1) {
    bsdcat_next();
    if (**(long **)(bsdcat_storage.argument + 0x18) == 0) {
      bsdcat_current_path = "<stdin>";
      bsdcat_read_to_stdout((char *)0x0);
    }
    else {
      while (**(long **)(bsdcat_storage.argument + 0x18) != 0) {
        puVar1 = *(undefined8 **)(bsdcat_storage.argument + 0x18);
        *(undefined8 **)(bsdcat_storage.argument + 0x18) = puVar1 + 1;
        bsdcat_current_path = (char *)*puVar1;
        bsdcat_read_to_stdout(bsdcat_current_path);
        bsdcat_next();
      }
      archive_read_free(a);
    }
    exit(exit_status);
  }
  if (iVar2 == 0) {
    version();
  }
  if (iVar2 != 0x68) {
    usage(_stderr,1);
  }
  usage(_stdout,0);
}

Assistant:

int
main(int argc, char **argv)
{
	struct bsdcat *bsdcat, bsdcat_storage;
	int c;

	bsdcat = &bsdcat_storage;
	memset(bsdcat, 0, sizeof(*bsdcat));

	lafe_setprogname(*argv, "bsdcat");

	bsdcat->argv = argv;
	bsdcat->argc = argc;

	while ((c = bsdcat_getopt(bsdcat)) != -1) {
		switch (c) {
		case 'h':
			usage(stdout, 0);
			/* NOTREACHED */
			/* Fallthrough */
		case OPTION_VERSION:
			version();
			/* NOTREACHED */
			/* Fallthrough */
		default:
			usage(stderr, 1);
			/* Fallthrough */
			/* NOTREACHED */
		}
	}

	bsdcat_next();
	if (*bsdcat->argv == NULL) {
		bsdcat_current_path = "<stdin>";
		bsdcat_read_to_stdout(NULL);
	} else {
		while (*bsdcat->argv) {
			bsdcat_current_path = *bsdcat->argv++;
			bsdcat_read_to_stdout(bsdcat_current_path);
			bsdcat_next();
		}
		archive_read_free(a); /* Help valgrind & friends */
	}

	exit(exit_status);
}